

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O0

uint32_t init_large_scale_tile_obu_header
                   (AV1_COMP *cpi,uint8_t **data,aom_write_bit_buffer *saved_wb,
                   uint8_t obu_extension_header,LargeTileFrameOBU *lst_obu)

{
  uint32_t uVar1;
  byte in_CL;
  long *in_RSI;
  long *in_RDI;
  uint *in_R8;
  char fn [20];
  uint32_t frame_header_size;
  OBU_TYPE obu_type;
  CurrentFrame *current_frame;
  AV1LevelParams *level_params;
  undefined4 in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa4;
  uint8_t *in_stack_ffffffffffffffa8;
  aom_write_bit_buffer *in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  undefined3 in_stack_ffffffffffffffc4;
  undefined4 uVar2;
  
  uVar2 = CONCAT13(6,in_stack_ffffffffffffffc4);
  uVar1 = av1_write_obu_header
                    ((AV1LevelParams *)(*in_RDI + 0x5a90),(int *)(in_RDI + 0x13a60),OBU_FRAME,
                     (_Bool)(*(byte *)(in_RDI[0x8401] + 0xf4) & 1),true,(uint)in_CL,
                     (uint8_t *)*in_RSI);
  *in_R8 = uVar1;
  *in_RSI = *in_RSI + (ulong)*in_R8;
  uVar1 = write_frame_header_obu
                    ((AV1_COMP *)CONCAT44(uVar2,in_stack_ffffffffffffffc0),
                     (MACROBLOCKD *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                     in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4);
  *in_RSI = *in_RSI + (ulong)uVar1;
  in_R8[1] = uVar1;
  if ((*(byte *)((long)in_RDI + 0x42682) & 1) != 0) {
    av1_print_uncompressed_frame_header
              ((uint8_t *)0x0,
               (uint)(uint3)(CONCAT16((char)((ulong)*(uint *)(in_RDI + 0x77f2) % 10) + '0',
                                      CONCAT15((char)(((ulong)*(uint *)(in_RDI + 0x77f2) % 100) / 10
                                                     ) + '0',
                                               CONCAT14((char)((ulong)*(uint *)(in_RDI + 0x77f2) /
                                                              100) + '0',0x68662f2e))) >> 0x20),
               (char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  }
  return uVar1;
}

Assistant:

static uint32_t init_large_scale_tile_obu_header(
    AV1_COMP *const cpi, uint8_t **data, struct aom_write_bit_buffer *saved_wb,
    uint8_t obu_extension_header, LargeTileFrameOBU *lst_obu) {
  AV1LevelParams *const level_params = &cpi->ppi->level_params;
  CurrentFrame *const current_frame = &cpi->common.current_frame;
  // For large_scale_tile case, we always have only one tile group, so it can
  // be written as an OBU_FRAME.
  const OBU_TYPE obu_type = OBU_FRAME;
  lst_obu->tg_hdr_size = av1_write_obu_header(
      level_params, &cpi->frame_header_count, obu_type,
      cpi->common.seq_params->has_nonzero_operating_point_idc,
      /*is_layer_specific_obu=*/true, obu_extension_header, *data);
  *data += lst_obu->tg_hdr_size;

  const uint32_t frame_header_size =
      write_frame_header_obu(cpi, &cpi->td.mb.e_mbd, saved_wb, *data, 0);
  *data += frame_header_size;
  lst_obu->frame_header_size = frame_header_size;
  // (yunqing) This test ensures the correctness of large scale tile coding.
  if (cpi->oxcf.tile_cfg.enable_ext_tile_debug) {
    char fn[20] = "./fh";
    fn[4] = current_frame->frame_number / 100 + '0';
    fn[5] = (current_frame->frame_number % 100) / 10 + '0';
    fn[6] = (current_frame->frame_number % 10) + '0';
    fn[7] = '\0';
    av1_print_uncompressed_frame_header(*data - frame_header_size,
                                        frame_header_size, fn);
  }
  return frame_header_size;
}